

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

btVector3 orth(btVector3 *v)

{
  btVector3 *this;
  btScalar bVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 b;
  btVector3 a;
  btVector3 local_48;
  btVector3 local_38;
  btVector3 local_28;
  
  local_38.m_floats = (btScalar  [4])(ZEXT816(0x3f800000) << 0x40);
  local_28 = btVector3::cross(v,&local_38);
  local_48.m_floats[0] = 0.0;
  local_48.m_floats[1] = 1.0;
  local_48.m_floats[2] = 0.0;
  local_48.m_floats[3] = 0.0;
  local_38 = btVector3::cross(v,&local_48);
  bVar1 = btVector3::length(&local_28);
  bVar2 = btVector3::length(&local_38);
  this = &local_38;
  if (bVar2 < bVar1) {
    this = &local_28;
  }
  bVar3 = btVector3::normalized(this);
  return (btVector3)bVar3.m_floats;
}

Assistant:

btVector3 orth(const btVector3 &v)
{
	btVector3 a=btCross(v,btVector3(0,0,1));
	btVector3 b=btCross(v,btVector3(0,1,0));
	if (a.length() > b.length())
	{
		return a.normalized();
	} else {
		return b.normalized();
	}
}